

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

LY_ERR lyxml_close_element(lyxml_ctx *xmlctx,char *prefix,size_t prefix_len,char *name,
                          size_t name_len,ly_bool empty)

{
  byte bVar1;
  uint32_t uVar2;
  lyd_node *plVar3;
  lyd_node_inner *__n;
  lyd_node *__n_00;
  ly_in *in;
  ly_ctx *ctx;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  
  uVar2 = (xmlctx->elements).count;
  if (uVar2 == 0) {
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Stray closing element tag (\"%.*s\").",name_len,
            name);
  }
  else {
    uVar8 = uVar2 - 1;
    plVar3 = (xmlctx->elements).field_2.dnodes[uVar8];
    __n = plVar3->parent;
    if ((((__n == (lyd_node_inner *)prefix_len) &&
         (__n_00 = plVar3->next, __n_00 == (lyd_node *)name_len)) &&
        ((prefix_len == 0 || (iVar4 = strncmp(prefix,*(char **)plVar3,(size_t)__n), iVar4 == 0))))
       && (iVar4 = strncmp(name,(char *)plVar3->schema,(size_t)__n_00), iVar4 == 0)) {
      ly_set_rm_index(&xmlctx->elements,uVar8,free);
      lyxml_ns_rm(xmlctx);
      do {
        in = xmlctx->in;
        bVar1 = *in->current;
        if (bVar1 < 0xd) {
          if (bVar1 != 9) {
            if (bVar1 != 10) {
LAB_001a5bb1:
              if (((empty != '\0') && (bVar1 == 0x2f)) &&
                 (ly_in_skip(in,1), *xmlctx->in->current == '\0')) {
                ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
                return LY_EVALID;
              }
              pcVar6 = xmlctx->in->current;
              if (*pcVar6 != '>') {
                ctx = xmlctx->ctx;
                uVar8 = LY_VCODE_INSTREXP_len(pcVar6);
                ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,
                        "Invalid character sequence \"%.*s\", expected %s.",(ulong)uVar8,
                        xmlctx->in->current,"element tag termination (\'>\')");
                return LY_EVALID;
              }
              ly_in_skip(xmlctx->in,1);
              return LY_SUCCESS;
            }
            in->line = in->line + 1;
          }
        }
        else if ((bVar1 != 0xd) && (bVar1 != 0x20)) goto LAB_001a5bb1;
        ly_in_skip(in,1);
      } while( true );
    }
    pcVar6 = *(char **)plVar3;
    bVar9 = pcVar6 == (char *)0x0;
    if (bVar9) {
      pcVar6 = "";
    }
    pcVar5 = ":";
    pcVar7 = ":";
    if (bVar9) {
      pcVar7 = "";
    }
    if (prefix == (char *)0x0) {
      prefix = "";
      pcVar5 = "";
    }
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,
            "Opening (\"%.*s%s%.*s\") and closing (\"%.*s%s%.*s\") elements tag mismatch.",
            (ulong)__n & 0xffffffff,pcVar6,pcVar7,(ulong)*(uint *)&plVar3->next,plVar3->schema,
            prefix_len,prefix,pcVar5,name_len,name);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyxml_close_element(struct lyxml_ctx *xmlctx, const char *prefix, size_t prefix_len, const char *name, size_t name_len,
        ly_bool empty)
{
    struct lyxml_elem *e;

    /* match opening and closing element tags */
    if (!xmlctx->elements.count) {
        LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Stray closing element tag (\"%.*s\").",
                (int)name_len, name);
        return LY_EVALID;
    }

    e = (struct lyxml_elem *)xmlctx->elements.objs[xmlctx->elements.count - 1];
    if ((e->prefix_len != prefix_len) || (e->name_len != name_len) ||
            (prefix_len && strncmp(prefix, e->prefix, e->prefix_len)) || strncmp(name, e->name, e->name_len)) {
        LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Opening (\"%.*s%s%.*s\") and closing (\"%.*s%s%.*s\") elements tag mismatch.",
                (int)e->prefix_len, e->prefix ? e->prefix : "", e->prefix ? ":" : "", (int)e->name_len, e->name,
                (int)prefix_len, prefix ? prefix : "", prefix ? ":" : "", (int)name_len, name);
        return LY_EVALID;
    }

    /* opening and closing element tags matches, remove record from the opening tags list */
    ly_set_rm_index(&xmlctx->elements, xmlctx->elements.count - 1, free);

    /* remove also the namespaces connected with the element */
    lyxml_ns_rm(xmlctx);

    /* skip WS */
    ign_xmlws(xmlctx);

    /* special "<elem/>" element */
    if (empty && (xmlctx->in->current[0] == '/')) {
        move_input(xmlctx, 1);
    }

    /* parse closing tag */
    if (xmlctx->in->current[0] != '>') {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "element tag termination ('>')");
        return LY_EVALID;
    }

    /* move after closing tag without checking for EOF */
    ly_in_skip(xmlctx->in, 1);

    return LY_SUCCESS;
}